

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O3

void __thiscall HttpRequest::parseMethod(HttpRequest *this,char *method)

{
  int iVar1;
  char **ppcVar2;
  uint32_t i;
  long lVar3;
  
  ppcVar2 = gMethodTypeList;
  lVar3 = 0;
  do {
    iVar1 = strcmp(method,*ppcVar2);
    if (iVar1 == 0) goto LAB_001198b5;
    lVar3 = lVar3 + 1;
    ppcVar2 = ppcVar2 + 1;
  } while (lVar3 != 8);
  lVar3 = 8;
LAB_001198b5:
  this->mMethod = (MethodType)lVar3;
  return;
}

Assistant:

void HttpRequest::parseMethod( const char *method )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	for ( uint32_t i = 0; i < JH_ARRAY_SIZE( gMethodTypeList ); i++ )
	{
		//LOG_NOISE( "matching %s", gMethodTypeList[ i ] );
		if ( strcmp( method, gMethodTypeList[ i ] ) == 0 )
		{
			mMethod = (MethodType)i;
			LOG( "Found method %s", gMethodTypeList[ mMethod ] );
			return;
		}
	}
	
	LOG( "Failed to match method \"%s\"", method );
	mMethod = kMethodUnknown;
}